

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::IsInPlane(ON_PolyCurve *this,ON_Plane *plane,double tolerance)

{
  int iVar1;
  uint uVar2;
  ON_Curve **ppOVar3;
  int local_30;
  int count;
  int i;
  bool rc;
  double tolerance_local;
  ON_Plane *plane_local;
  ON_PolyCurve *this_local;
  
  count._3_1_ = false;
  iVar1 = Count(this);
  local_30 = 0;
  while( true ) {
    if (iVar1 <= local_30) {
      return count._3_1_;
    }
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_30);
    if (*ppOVar3 == (ON_Curve *)0x0) break;
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_30);
    uVar2 = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x33])
                      (tolerance,*ppOVar3,plane);
    count._3_1_ = (bool)((byte)uVar2 & 1);
    if ((uVar2 & 1) == 0) {
      return count._3_1_;
    }
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool
ON_PolyCurve::IsInPlane(
      const ON_Plane& plane, // plane to test
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  int i, count = Count();
  for ( i = 0; i < count; i++ )
  {
    if ( !m_segment[i] )
      return false;
    rc = m_segment[i]->IsInPlane( plane, tolerance );
    if ( !rc )
      break;
  }
  return rc;
}